

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O1

bool __thiscall
QSystemSemaphorePosix::handle
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,AccessMode mode)

{
  QArrayData *data;
  QChar *data_00;
  qsizetype size;
  int iVar1;
  sem_t *psVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QAnyStringView a;
  QString local_88;
  QString local_70;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = true;
  if (this->semaphore != (sem_t *)0x0) goto LAB_004aaee9;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  data = &((self->nativeKey).key.d.d)->super_QArrayData;
  data_00 = (QChar *)(self->nativeKey).key.d.ptr;
  size = (self->nativeKey).key.d.size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toLocal8Bit_helper(&local_58,data_00,size);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
    QCoreApplication::translate(&local_88,"QSystemSemaphore","%1: key is empty",(char *)0x0,-1);
    a.m_size = 0x4000000000000018;
    a.field_0.m_data_utf8 = "QSystemSemaphore::handle";
    QString::arg_impl(&local_70,&local_88,a,0,(QChar)0x20);
    self->error = KeyError;
    QString::operator=(&self->errorString,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_004ab0f0:
    bVar7 = false;
  }
  else {
    uVar8 = 0xc0;
    uVar5 = 0;
    do {
      do {
        pcVar6 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar6 = "";
        }
        psVar2 = sem_open(pcVar6,(uint)uVar8,0x180,(ulong)(uint)self->initialValue);
        this->semaphore = (sem_t *)psVar2;
        if (psVar2 != (sem_t *)0x0) goto LAB_004ab018;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      piVar3 = __errno_location();
      if (*piVar3 != 0x11) break;
      if (mode == Create) {
        pcVar6 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar6 = "";
        }
        iVar1 = sem_unlink(pcVar6);
        uVar4 = 3;
        if ((iVar1 == -1) && (*piVar3 != 2)) {
          function_00.m_data = "QSystemSemaphore::handle (sem_unlink)";
          function_00.m_size = 0x25;
          QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
          goto LAB_004ab0f0;
        }
      }
      else {
        uVar8 = (ulong)((uint)uVar8 & 0xffffff7f);
        uVar4 = 2;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
LAB_004ab018:
    if (this->semaphore == (sem_t *)0x0) {
      function.m_data = "QSystemSemaphore::handle";
      function.m_size = 0x18;
      QSystemSemaphorePrivate::setUnixErrorString(self,function);
      goto LAB_004ab0f0;
    }
    this->createdSemaphore = SUB81(uVar8 >> 7,0);
    bVar7 = true;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_004aaee9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QSystemSemaphorePosix::handle(QSystemSemaphorePrivate *self, QSystemSemaphore::AccessMode mode)
{
    if (semaphore != SEM_FAILED)
        return true;  // we already have a semaphore

    const QByteArray semName = QFile::encodeName(self->nativeKey.nativeKey());
    if (semName.isEmpty()) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: key is empty")
                       .arg("QSystemSemaphore::handle"_L1));
        return false;
    }

    // Always try with O_EXCL so we know whether we created the semaphore.
    int oflag = O_CREAT | O_EXCL;
    for (int tryNum = 0, maxTries = 1; tryNum < maxTries; ++tryNum) {
        do {
            semaphore = ::sem_open(semName.constData(), oflag, 0600, self->initialValue);
        } while (semaphore == SEM_FAILED && errno == EINTR);
        if (semaphore == SEM_FAILED && errno == EEXIST) {
            if (mode == QSystemSemaphore::Create) {
                if (::sem_unlink(semName.constData()) == -1 && errno != ENOENT) {
                    self->setUnixErrorString("QSystemSemaphore::handle (sem_unlink)"_L1);
                    return false;
                }
                // Race condition: the semaphore might be recreated before
                // we call sem_open again, so we'll retry several times.
                maxTries = 3;
            } else {
                // Race condition: if it no longer exists at the next sem_open
                // call, we won't realize we created it, so we'll leak it later.
                oflag &= ~O_EXCL;
                maxTries = 2;
            }
        } else {
            break;
        }
    }

    if (semaphore == SEM_FAILED) {
        self->setUnixErrorString("QSystemSemaphore::handle"_L1);
        return false;
    }

    createdSemaphore = (oflag & O_EXCL) != 0;

    return true;
}